

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O3

Vec_Int_t *
Gia_ManMaxiTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  Vec_Int_t *pVVar4;
  
  if (vInit0 != (Vec_Int_t *)0x0) {
    pVVar3 = Gia_ManMaxiPerform(p,vInit0,nFrames,nTimeOut,fVerbose);
    return pVVar3;
  }
  iVar1 = p->nRegs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  pVVar4 = Gia_ManMaxiPerform(p,pVVar3,nFrames,nTimeOut,fVerbose);
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_ManMaxiTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = vInit0 ? vInit0 : Vec_IntStart( Gia_ManRegNum(p) );
    vRes = Gia_ManMaxiPerform( p, vInit, nFrames, nTimeOut, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}